

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mask.c
# Opt level: O2

void mask_print(FILE *out,uint32_t *mask,int size)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = (long)(size + 0x1f) / 0x20;
  uVar2 = uVar1 & 0xffffffff;
  if ((int)uVar1 < 1) {
    uVar2 = 0;
  }
  for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    if (uVar1 != 0) {
      fputc(0x20,(FILE *)out);
    }
    fprintf((FILE *)out,"%08x",(ulong)mask[uVar1]);
  }
  return;
}

Assistant:

void mask_print(FILE *out, uint32_t *mask, int size) {
	int rsize = MASK_SIZE(size);
	int i;
	for (i = 0; i < rsize; i++) {
		if (i)
			fprintf(out, " ");
		fprintf (out, "%08"PRIx32, mask[i]);
	}
}